

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O3

void __thiscall cmake::AddCacheEntry(cmake *this,string *key,char *value,char *helpString,int type)

{
  size_t sVar1;
  cmValue value_00;
  string local_50;
  
  if (value == (char *)0x0) {
    value_00.Value = (string *)0x0;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen(value);
    value_00.Value = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)value_00.Value,value,value + sVar1);
  }
  AddCacheEntry(this,key,value_00,helpString,type);
  if ((value != (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AddCacheEntry(const std::string& key, const char* value,
                     const char* helpString, int type)
  {
    this->AddCacheEntry(key,
                        value ? cmValue(std::string(value)) : cmValue(nullptr),
                        helpString, type);
  }